

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

Id dxil_spv::build_constant_expression(Impl *impl,ConstantExpr *cexpr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  TypeID TVar6;
  Id IVar7;
  StorageClass SVar8;
  ValueKind VVar9;
  Id IVar10;
  uint uVar11;
  Id IVar12;
  Type *pTVar13;
  Constant *pCVar14;
  Value *pVVar15;
  APInt *pAVar16;
  uint64_t uVar17;
  LoggingCallback p_Var18;
  Operation *pOVar19;
  Builder *pBVar20;
  ConstantExpr *pCVar21;
  Constant *this;
  Type *pTVar22;
  Type *pTVar23;
  void *pvVar24;
  mapped_type *pmVar25;
  mapped_type *pmVar26;
  int iVar27;
  bool is_signed;
  Op op;
  uint uVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  char buffer [4096];
  Op local_105c;
  bool local_1050;
  undefined1 local_1040 [8];
  initializer_list<unsigned_int> local_1038;
  undefined1 uStack_1028;
  undefined4 uStack_1027;
  undefined4 uStack_1023;
  uint uStack_101f;
  undefined2 uStack_101b;
  undefined4 uStack_1019;
  undefined5 uStack_1015;
  undefined6 uStack_1010;
  undefined1 uStack_100a;
  undefined1 uStack_1009;
  undefined6 uStack_1008;
  undefined1 uStack_1002;
  undefined1 uStack_1001;
  undefined6 uStack_1000;
  
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  if (0x11 < uVar5 - 0x12d) {
    if (0xc < uVar5 - 0x65) {
      if (uVar5 != 200) {
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
        local_1038._M_array = (iterator)0x206e776f6e6b6e55;
        local_1038._M_len._0_1_ = 'c';
        local_1038._M_len._1_1_ = 'o';
        local_1038._M_len._2_2_ = 0x736e;
        local_1038._M_len._4_1_ = 't';
        local_1038._M_len._5_1_ = 'a';
        local_1038._M_len._6_1_ = 'n';
        local_1038._M_len._7_1_ = 't';
        uStack_1028 = 0x2d;
        uStack_1027 = 0x72707865;
        uStack_1023._0_3_ = 0xa2e;
        goto LAB_00153ac9;
      }
      pBVar20 = Converter::Impl::builder(impl);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
      IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar7);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar8 = spv::Builder::getStorageClass(pBVar20,IVar10);
      SVar8 = Converter::Impl::get_effective_storage_class(impl,&pCVar14->super_Value,SVar8);
      IVar7 = spv::Builder::makePointer(pBVar20,SVar8,IVar7);
      pOVar19 = Converter::Impl::allocate(impl,OpAccessChain,IVar7);
      Operation::add_id(pOVar19,IVar10);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
      pVVar15 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
      VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
      if (VVar9 == ConstantInt) {
        pCVar14 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
        VVar9 = LLVMBC::Value::get_value_kind((Value *)pCVar14);
        if (VVar9 != ConstantInt) {
          p_Var18 = get_thread_log_callback();
          if (p_Var18 == (LoggingCallback)0x0) {
            build_constant_expression();
            std::terminate();
          }
          goto LAB_001542cc;
        }
        pAVar16 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar17 = LLVMBC::APInt::getZExtValue(pAVar16);
        if (uVar17 == 0) {
          uVar5 = LLVMBC::ConstantExpr::getNumOperands(cexpr);
          if (2 < uVar5) {
            uVar28 = 2;
            do {
              pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar28);
              IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
              Operation::add_id(pOVar19,IVar10);
              uVar28 = uVar28 + 1;
            } while (uVar5 != uVar28);
          }
          Converter::Impl::add(impl,pOVar19,false);
          goto LAB_00153e7e;
        }
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
      }
      else {
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
      }
      uStack_1015 = 0x74736e6f63;
      uStack_1010 = 0x2e3020746e61;
      uStack_100a = 10;
      uStack_1009 = 0;
      uStack_1028 = 0x50;
      uStack_1027 = 0x6f207274;
      uStack_1023 = 0x61726570;
      uStack_101f = 0x6920646e;
      uStack_101b = 0x2073;
      uStack_1019 = 0x20746f6e;
      uVar30._0_1_ = 'F';
      uVar30._1_1_ = 'i';
      uVar30._2_1_ = 'r';
      uVar30._3_1_ = 's';
      uVar31._0_1_ = 't';
      uVar31._1_1_ = ' ';
      uVar31._2_1_ = 'G';
      uVar31._3_1_ = 'e';
      uVar32._0_1_ = 't';
      uVar32._1_1_ = 'E';
      uVar32._2_1_ = 'l';
      uVar32._3_1_ = 'e';
      local_1038._M_len._4_1_ = 'm';
      local_1038._M_len._5_1_ = 'e';
      local_1038._M_len._6_1_ = 'n';
      local_1038._M_len._7_1_ = 't';
      goto LAB_0015374c;
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    if (uVar5 == 0x6c) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 == FloatTyID) {
        pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == HalfTyID) &&
           (bVar2 = Converter::Impl::support_native_fp16_operations(impl), !bVar2)) {
          if ((impl->options).arithmetic_relaxed_precision == true) {
            pOVar19 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr);
            pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
            IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
            Operation::add_id(pOVar19,IVar10);
            Converter::Impl::add(impl,pOVar19,false);
            IVar10 = pOVar19->id;
            pBVar20 = Converter::Impl::builder(impl);
            spv::Builder::addDecoration(pBVar20,IVar10,DecorationRelaxedPrecision,-1);
            return IVar10;
          }
LAB_001536bf:
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
          IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
          goto LAB_00153d88;
        }
      }
    }
    else if (uVar5 == 0x6d) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 == FloatTyID) {
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == HalfTyID) &&
           (bVar2 = Converter::Impl::support_native_fp16_operations(impl), !bVar2))
        goto LAB_001536bf;
      }
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    switch(uVar5) {
    case 0x65:
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
        pBVar20 = Converter::Impl::builder(impl);
        pOVar19 = Converter::Impl::allocate(impl,OpINotEqual,(Value *)cexpr);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,false);
        Operation::add_id(pOVar19,IVar10);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
        if ((int)uVar5 < 0x10) {
          if (uVar5 == 1) {
            return 0;
          }
          if (uVar5 == 8) {
            return 0;
          }
LAB_00153ea1:
          if (uVar5 < 0x21) {
LAB_00154073:
            iVar27 = 0x20;
LAB_00154085:
            IVar10 = spv::Builder::makeIntegerType(pBVar20,iVar27,false);
            IVar10 = spv::Builder::makeIntConstant(pBVar20,IVar10,0,false);
            goto LAB_0015409a;
          }
        }
        else {
          if (uVar5 == 0x10) {
            iVar27 = 0x10;
            goto LAB_00154085;
          }
          if (uVar5 == 0x20) goto LAB_00154073;
          if (uVar5 != 0x40) goto LAB_00153ea1;
        }
        IVar10 = spv::Builder::makeIntegerType(pBVar20,0x40,false);
        IVar10 = spv::Builder::makeInt64Constant(pBVar20,IVar10,0,false);
LAB_0015409a:
        Operation::add_id(pOVar19,IVar10);
        Converter::Impl::add(impl,pOVar19,false);
        return pOVar19->id;
      }
      goto LAB_001536e9;
    case 0x66:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_001533bc:
        bVar2 = false;
LAB_001533f6:
        IVar10 = emit_boolean_convert_instruction<LLVMBC::ConstantExpr>(impl,cexpr,bVar2);
        return IVar10;
      }
LAB_001536e9:
      IVar10 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpUConvert);
      if (IVar10 != 0) {
        return IVar10;
      }
      local_105c = OpUConvert;
      break;
    case 0x67:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_001533eb:
        bVar2 = true;
        goto LAB_001533f6;
      }
      IVar10 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpSConvert);
      if (IVar10 != 0) {
        return IVar10;
      }
      local_105c = OpSConvert;
      local_1050 = true;
      bVar2 = false;
      goto LAB_00153777;
    case 0x68:
      local_105c = OpConvertFToU;
      break;
    case 0x69:
      local_105c = OpConvertFToS;
      break;
    case 0x6a:
      bVar2 = false;
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_001533bc;
      local_105c = OpConvertUToF;
      goto LAB_0015376f;
    case 0x6b:
      bVar2 = false;
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_001533eb;
      local_1050 = true;
      local_105c = OpConvertSToF;
      goto LAB_00153777;
    case 0x6c:
    case 0x6d:
      local_105c = OpFConvert;
      bVar2 = true;
      goto LAB_0015376f;
    default:
      p_Var18 = get_thread_log_callback();
      if (p_Var18 == (LoggingCallback)0x0) {
        build_constant_expression();
        return 0;
      }
      uStack_1028 = 0x72;
      uStack_1027 = 0x6f697461;
      uStack_1023 = 0xa2e6e;
      uVar30._0_1_ = 'U';
      uVar30._1_1_ = 'n';
      uVar30._2_1_ = 'k';
      uVar30._3_1_ = 'n';
      uVar31._0_1_ = 'o';
      uVar31._1_1_ = 'w';
      uVar31._2_1_ = 'n';
      uVar31._3_1_ = ' ';
      uVar32._0_1_ = 'c';
      uVar32._1_1_ = 'a';
      uVar32._2_1_ = 's';
      uVar32._3_1_ = 't';
      local_1038._M_len._4_1_ = ' ';
      local_1038._M_len._5_1_ = 'o';
      local_1038._M_len._6_1_ = 'p';
      local_1038._M_len._7_1_ = 'e';
      goto LAB_0015374c;
    case 0x70:
      local_105c = OpBitcast;
    }
    bVar2 = false;
LAB_0015376f:
    local_1050 = false;
LAB_00153777:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getPointerAddressSpace(pTVar13);
      if ((char)uVar5 == '\x03') {
        uVar5 = 0;
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pVVar15 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
        VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
        uVar17 = 0;
        while (VVar9 == ConstantExpr) {
          pCVar21 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar9 = LLVMBC::Value::get_value_kind((Value *)pCVar21);
          if (VVar9 != ConstantExpr) {
            p_Var18 = get_thread_log_callback();
            if (p_Var18 == (LoggingCallback)0x0) {
              build_constant_expression();
              std::terminate();
            }
            goto LAB_001542cc;
          }
          uVar28 = LLVMBC::ConstantExpr::getOpcode(pCVar21);
          if ((uVar28 == 200) &&
             (uVar28 = LLVMBC::ConstantExpr::getNumOperands(pCVar21), uVar28 == 3)) {
            this = LLVMBC::ConstantExpr::getOperand(pCVar21,2);
            pAVar16 = LLVMBC::Constant::getUniqueInteger(this);
            uVar17 = LLVMBC::APInt::getZExtValue(pAVar16);
          }
          pCVar21 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar9 = LLVMBC::Value::get_value_kind((Value *)pCVar21);
          if (VVar9 != ConstantExpr) {
            p_Var18 = get_thread_log_callback();
            if (p_Var18 == (LoggingCallback)0x0) {
              build_constant_expression();
              std::terminate();
            }
            goto LAB_001542cc;
          }
          pCVar14 = LLVMBC::ConstantExpr::getOperand(pCVar21,0);
          pVVar15 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
        }
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if (TVar6 == ArrayTyID) {
          uVar5 = 0;
          do {
            uVar5 = uVar5 + 1;
            pTVar13 = LLVMBC::Type::getArrayElementType(pTVar13);
            TVar6 = LLVMBC::Type::getTypeID(pTVar13);
          } while (TVar6 == ArrayTyID);
        }
        pTVar22 = LLVMBC::Value::getType((Value *)cexpr);
        pTVar22 = LLVMBC::Type::getPointerElementType(pTVar22);
        TVar6 = LLVMBC::Type::getTypeID(pTVar22);
        uVar28 = 0;
        if (TVar6 == ArrayTyID) {
          uVar28 = 0;
          do {
            uVar28 = uVar28 + 1;
            pTVar22 = LLVMBC::Type::getArrayElementType(pTVar22);
            TVar6 = LLVMBC::Type::getTypeID(pTVar22);
          } while (TVar6 == ArrayTyID);
        }
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == IntegerTyID) &&
           (uVar11 = LLVMBC::Type::getIntegerBitWidth(pTVar13), uVar11 == 8)) {
          if ((uVar17 & 3) == 0) {
            pBVar20 = Converter::Impl::builder(impl);
            IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
            iVar27 = uVar5 - uVar28;
            if (uVar28 <= uVar5 && iVar27 != 0) {
              IVar7 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
              IVar7 = spv::Builder::makePointer(pBVar20,StorageClassWorkgroup,IVar7);
              pOVar19 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar7);
              Operation::add_id(pOVar19,IVar10);
              uVar29 = uVar17 >> 2 & 0x3fffffff;
              do {
                IVar10 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
                IVar10 = spv::Builder::makeIntConstant(pBVar20,IVar10,(uint)uVar29,false);
                Operation::add_id(pOVar19,IVar10);
                uVar29 = 0;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
              Converter::Impl::add(impl,pOVar19,false);
              IVar10 = pOVar19->id;
            }
            Converter::Impl::rewrite_value(impl,(Value *)cexpr,IVar10);
            IVar7 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
            local_1038._M_array = (iterator)cexpr;
            pmVar25 = std::__detail::
                      _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&impl->llvm_value_actual_type,(key_type *)&local_1038);
            *pmVar25 = IVar7;
            if (IVar10 != 0) {
              return IVar10;
            }
          }
          else {
            p_Var18 = get_thread_log_callback();
            if (p_Var18 == (LoggingCallback)0x0) {
              build_constant_expression();
            }
            else {
              uStack_1015 = 0x66666f2070;
              uStack_1010 = 0x6f6620746573;
              uStack_100a = 0x72;
              uStack_1028 = 0x61;
              uStack_1027 = 0x6e67696c;
              uStack_1023 = 0x63206465;
              uStack_101f = 0x74736e6f;
              uStack_101b = 0x6e61;
              uStack_1019 = 0x65672074;
              local_1038._M_array = (iterator)0x6465746365707845;
              local_1038._M_len._0_1_ = 0x20;
              local_1038._M_len._1_1_ = 0x34;
              local_1038._M_len._2_2_ = 0x6220;
              local_1038._M_len._4_4_ = 0x20657479;
              uStack_1009 = 0x20;
              uStack_1008._0_4_ = 0x4d534754;
              uStack_1008._4_2_ = 0xa2e;
              uStack_1002 = 0;
              pvVar24 = get_thread_log_callback_userdata();
              (*p_Var18)(pvVar24,Error,(char *)&local_1038);
            }
          }
        }
      }
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 != PointerTyID) {
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          std::terminate();
        }
LAB_001542cc:
        uStack_1028 = 0x69;
        uStack_1027 = 0x6163206e;
        uStack_1023 = 0x543c7473;
        uStack_101f = 0xa2e3e;
        local_1038._M_array = (iterator)0x2064696c61766e49;
        local_1038._M_len._0_1_ = 0x74;
        local_1038._M_len._1_1_ = 0x79;
        local_1038._M_len._2_2_ = 0x6570;
        local_1038._M_len._4_4_ = 0x20444920;
        pvVar24 = get_thread_log_callback_userdata();
        (*p_Var18)(pvVar24,Error,(char *)&local_1038);
        std::terminate();
      }
      pTVar22 = LLVMBC::Type::getPointerElementType(pTVar13);
      pTVar23 = LLVMBC::Value::getType((Value *)cexpr);
      TVar6 = LLVMBC::Type::getTypeID(pTVar23);
      if (TVar6 != PointerTyID) {
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          std::terminate();
        }
        goto LAB_001542cc;
      }
      pTVar23 = LLVMBC::Type::getPointerElementType(pTVar23);
      TVar6 = LLVMBC::Type::getTypeID(pTVar22);
      uVar28 = 0;
      uVar5 = 0;
      while (TVar6 == ArrayTyID) {
        pTVar22 = LLVMBC::Type::getArrayElementType(pTVar22);
        uVar5 = uVar5 + 1;
        TVar6 = LLVMBC::Type::getTypeID(pTVar22);
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar23);
      if (TVar6 == ArrayTyID) {
        uVar28 = 0;
        do {
          pTVar23 = LLVMBC::Type::getArrayElementType(pTVar23);
          uVar28 = uVar28 + 1;
          TVar6 = LLVMBC::Type::getTypeID(pTVar23);
        } while (TVar6 == ArrayTyID);
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar22);
      if ((TVar6 == PointerTyID) || (TVar6 = LLVMBC::Type::getTypeID(pTVar23), TVar6 == PointerTyID)
         ) {
        p_Var18 = get_thread_log_callback();
        if (p_Var18 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
        uStack_1028 = 0x69;
        uStack_1027 = 0x7265746e;
        uStack_1023 = 0x2d6f742d;
        uStack_101f = 0x6e696f70;
        uStack_101b = 0x6574;
        local_1038._M_array = (iterator)0x6820746f6e6e6143;
        local_1038._M_len._0_1_ = 'a';
        local_1038._M_len._1_1_ = 'n';
        local_1038._M_len._2_2_ = 0x6c64;
        local_1038._M_len._4_1_ = 'e';
        local_1038._M_len._5_1_ = ' ';
        local_1038._M_len._6_1_ = 'p';
        local_1038._M_len._7_1_ = 'o';
        uStack_1019 = 0xa2e72;
        goto LAB_00153ac9;
      }
      IVar10 = Converter::Impl::get_type_id(impl,pTVar22,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar10);
      uVar11 = LLVMBC::Type::getAddressSpace(pTVar13);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar8 = Converter::Impl::get_effective_storage_class
                        (impl,&pCVar14->super_Value,
                         (uint)((char)uVar11 != '\x03') * 3 + StorageClassWorkgroup);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      if (uVar28 == uVar5) {
        pVVar15 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
        VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
        if (VVar9 == ConstantExpr) goto LAB_00154206;
        pBVar20 = Converter::Impl::builder(impl);
        IVar12 = spv::Builder::makePointer(pBVar20,SVar8,IVar7);
        pOVar19 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr,IVar12);
        Operation::add_id(pOVar19,IVar10);
      }
      else {
        if (uVar5 < uVar28) {
          p_Var18 = get_thread_log_callback();
          if (p_Var18 == (LoggingCallback)0x0) {
            build_constant_expression();
            return 0;
          }
          uStack_1015 = 0x7272612065;
          uStack_1010 = 0x6d6964207961;
          uStack_100a = 0x65;
          uStack_1009 = 0x6e;
          uStack_1028 = 0x65;
          uStack_1027 = 0x68772072;
          uStack_1023 = 0x20656c69;
          uStack_101f = 0x69646461;
          uStack_101b = 0x676e;
          uStack_1019 = 0x726f6d20;
          local_1038._M_array = (iterator)0x6974736163746942;
          local_1038._M_len._0_1_ = 'n';
          local_1038._M_len._1_1_ = 'g';
          local_1038._M_len._2_2_ = 0x7020;
          local_1038._M_len._4_1_ = 'o';
          local_1038._M_len._5_1_ = 'i';
          local_1038._M_len._6_1_ = 'n';
          local_1038._M_len._7_1_ = 't';
          uStack_1008._0_4_ = 0x6e6f6973;
          uStack_1008._4_2_ = 0x2e73;
          uStack_1002 = 10;
          uStack_1001 = 0;
LAB_00153ac9:
          pvVar24 = get_thread_log_callback_userdata();
          (*p_Var18)(pvVar24,Error,(char *)&local_1038);
          return 0;
        }
        if (uVar28 != 0) {
          p_Var18 = get_thread_log_callback();
          if (p_Var18 == (LoggingCallback)0x0) {
            build_constant_expression();
            return 0;
          }
          uStack_1008._0_4_ = 0x6d696420;
          uStack_1008._4_2_ = 0x6e65;
          uStack_1002 = 0x73;
          uStack_1001 = 0x69;
          uStack_1000 = 0xa2e736e6f;
          uStack_1015 = 0x207265626d;
          uStack_1010 = 0x72726120666f;
          uStack_100a = 0x61;
          uStack_1009 = 0x79;
          uStack_1028 = 0x65;
          uStack_1027 = 0x6f742072;
          uStack_1023 = 0x656e7520;
          uStack_101f = 0x63657078;
          uStack_101b = 0x6574;
          uStack_1019 = 0x756e2064;
          uVar30._0_1_ = 'B';
          uVar30._1_1_ = 'i';
          uVar30._2_1_ = 't';
          uVar30._3_1_ = 'c';
          uVar31._0_1_ = 'a';
          uVar31._1_1_ = 's';
          uVar31._2_1_ = 't';
          uVar31._3_1_ = 'i';
          uVar32._0_1_ = 'n';
          uVar32._1_1_ = 'g';
          uVar32._2_1_ = ' ';
          uVar32._3_1_ = 'p';
          local_1038._M_len._4_1_ = 'o';
          local_1038._M_len._5_1_ = 'i';
          local_1038._M_len._6_1_ = 'n';
          local_1038._M_len._7_1_ = 't';
LAB_0015374c:
          local_1038._M_array = (iterator)CONCAT44(uVar31,uVar30);
          local_1038._M_len._0_1_ = (char)uVar32;
          local_1038._M_len._1_1_ = SUB41(uVar32,1);
          local_1038._M_len._2_2_ = SUB42(uVar32,2);
          goto LAB_00153ac9;
        }
        pBVar20 = Converter::Impl::builder(impl);
        IVar12 = spv::Builder::makePointer(pBVar20,SVar8,IVar7);
        pOVar19 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar12);
        Operation::add_id(pOVar19,IVar10);
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          pBVar20 = Converter::Impl::builder(impl);
          IVar10 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
          IVar10 = spv::Builder::makeIntConstant(pBVar20,IVar10,0,false);
          Operation::add_id(pOVar19,IVar10);
        }
      }
      Converter::Impl::add(impl,pOVar19,false);
      IVar10 = pOVar19->id;
LAB_00154206:
      local_1038._M_array = (iterator)cexpr;
      pmVar25 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_value_actual_type,(key_type *)&local_1038);
      *pmVar25 = IVar7;
      local_1038._M_array = (iterator)cexpr;
      pmVar26 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_storage_class,(key_type *)&local_1038);
      *pmVar26 = SVar8;
      return IVar10;
    }
    pVVar15 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
    VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
    if (VVar9 == ConstantExpr) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      IVar10 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pOVar19 = Converter::Impl::allocate(impl,local_105c,IVar10);
    }
    else {
      pOVar19 = Converter::Impl::allocate(impl,local_105c,(Value *)cexpr);
    }
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
    IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,local_1050);
    Operation::add_id(pOVar19,IVar10);
    Converter::Impl::add(impl,pOVar19,false);
    if (!bVar2) goto LAB_00153e7e;
    goto LAB_00153e65;
  }
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  switch(uVar5) {
  case 0x12d:
    op = OpIAdd;
    break;
  case 0x12e:
    bVar2 = true;
    op = OpFAdd;
    goto LAB_00153cdb;
  case 0x12f:
    op = OpISub;
    break;
  case 0x130:
    bVar2 = true;
    op = OpFSub;
    goto LAB_00153cdb;
  case 0x131:
    op = OpIMul;
    break;
  case 0x132:
    bVar2 = true;
    op = OpFMul;
    goto LAB_00153cdb;
  case 0x133:
    op = OpUDiv;
    goto LAB_001535ea;
  case 0x134:
    op = OpSDiv;
    goto LAB_00153631;
  case 0x135:
    bVar2 = true;
    op = OpFDiv;
    goto LAB_00153cdb;
  case 0x136:
    op = OpUMod;
    goto LAB_001535ea;
  case 0x137:
    op = OpSRem;
    goto LAB_00153631;
  case 0x138:
    bVar2 = true;
    op = OpFRem;
    goto LAB_00153cdb;
  case 0x139:
    op = OpShiftLeftLogical;
    break;
  case 0x13a:
    op = OpShiftRightLogical;
LAB_001535ea:
    bVar1 = true;
    bVar2 = false;
    goto LAB_00153ce3;
  case 0x13b:
    op = OpShiftRightArithmetic;
LAB_00153631:
    bVar1 = true;
    bVar2 = false;
    is_signed = true;
    goto LAB_00153ce5;
  case 0x13c:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = (uint)(uVar5 != 1) * 0x20 + OpLogicalAnd;
    break;
  case 0x13d:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = OpBitwiseOr;
    if (uVar5 == 1) {
      op = OpLogicalOr;
    }
    break;
  case 0x13e:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    if (uVar5 == 1) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      if (pCVar14 != (Constant *)0x0) {
        pCVar14 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
        VVar9 = LLVMBC::Value::get_value_kind((Value *)pCVar14);
        if (VVar9 != ConstantInt) goto LAB_00153c38;
        pAVar16 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar17 = LLVMBC::APInt::getZExtValue(pAVar16);
        uVar5 = 1;
        if (uVar17 == 0) {
          op = OpLogicalNotEqual;
          break;
        }
LAB_00153c6f:
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar5);
        IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
        if (IVar10 != 0) {
          pVVar15 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
          VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
          if (VVar9 == ConstantExpr) {
            pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
            IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
            pOVar19 = Converter::Impl::allocate(impl,OpLogicalNot,IVar7);
          }
          else {
            pOVar19 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)cexpr);
          }
          Operation::add_id(pOVar19,IVar10);
          Converter::Impl::add(impl,pOVar19,false);
          return pOVar19->id;
        }
        bVar2 = false;
        op = OpLogicalNotEqual;
        goto LAB_00153cdb;
      }
LAB_00153c38:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
      pCVar14 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(&pCVar14->super_Value)->super_Constant;
      uVar5 = 0;
      op = OpLogicalNotEqual;
      if (pCVar14 != (Constant *)0x0) {
        pAVar16 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar17 = LLVMBC::APInt::getZExtValue(pAVar16);
        if (uVar17 != 0) goto LAB_00153c6f;
      }
    }
    else {
      op = OpBitwiseXor;
    }
    break;
  default:
    p_Var18 = get_thread_log_callback();
    if (p_Var18 == (LoggingCallback)0x0) {
      build_constant_expression();
      return 0;
    }
    uStack_1028 = 0x70;
    uStack_1027 = 0x74617265;
    uStack_1023 = 0xa2e726f;
    uStack_101f = uStack_101f & 0xffffff00;
    uVar30._0_1_ = 'U';
    uVar30._1_1_ = 'n';
    uVar30._2_1_ = 'k';
    uVar30._3_1_ = 'n';
    uVar31._0_1_ = 'o';
    uVar31._1_1_ = 'w';
    uVar31._2_1_ = 'n';
    uVar31._3_1_ = ' ';
    uVar32._0_1_ = 'b';
    uVar32._1_1_ = 'i';
    uVar32._2_1_ = 'n';
    uVar32._3_1_ = 'a';
    local_1038._M_len._4_1_ = 'r';
    local_1038._M_len._5_1_ = 'y';
    local_1038._M_len._6_1_ = ' ';
    local_1038._M_len._7_1_ = 'o';
    goto LAB_0015374c;
  }
  bVar2 = false;
LAB_00153cdb:
  bVar1 = false;
LAB_00153ce3:
  is_signed = false;
LAB_00153ce5:
  IVar10 = 0;
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  bVar3 = instruction_is_undefined_value(&pCVar14->super_Value);
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
  bVar4 = instruction_is_undefined_value(&pCVar14->super_Value);
  if (bVar3 || bVar4) {
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,(uint)!bVar4);
    IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  pVVar15 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
  VVar9 = LLVMBC::Value::get_value_kind(pVVar15);
  if (VVar9 == ConstantExpr) {
    if (IVar10 != 0) {
      return IVar10;
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    IVar10 = Converter::Impl::get_type_id(impl,pTVar13,0);
    pOVar19 = Converter::Impl::allocate(impl,op,IVar10);
  }
  else {
    if (IVar10 != 0) {
LAB_00153d88:
      Converter::Impl::rewrite_value(impl,(Value *)cexpr,IVar10);
      return IVar10;
    }
    pOVar19 = Converter::Impl::allocate(impl,op,(Value *)cexpr);
  }
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  if (bVar1) {
    IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_1040._4_4_ = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
  }
  else {
    IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_1040._4_4_ = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  local_1038._M_array = (iterator)local_1040;
  local_1038._M_len._0_1_ = 2;
  local_1038._M_len._1_1_ = 0;
  local_1038._M_len._2_2_ = 0;
  local_1038._M_len._4_4_ = 0;
  local_1040._0_4_ = IVar10;
  Operation::add_ids(pOVar19,&local_1038);
  Converter::Impl::add(impl,pOVar19,false);
  if (bVar2) {
    pBVar20 = Converter::Impl::builder(impl);
    spv::Builder::addDecoration(pBVar20,pOVar19->id,DecorationNoContraction,-1);
LAB_00153e65:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar13,pOVar19->id,false);
  }
LAB_00153e7e:
  return pOVar19->id;
}

Assistant:

spv::Id build_constant_expression(Converter::Impl &impl, const llvm::ConstantExpr *cexpr)
{
	switch (cexpr->getOpcode())
	{
	case llvm::Instruction::GetElementPtr:
		return build_constant_getelementptr(impl, cexpr);

	case llvm::Instruction::Trunc:
	case llvm::Instruction::ZExt:
	case llvm::Instruction::SExt:
	case llvm::Instruction::FPToUI:
	case llvm::Instruction::FPToSI:
	case llvm::Instruction::UIToFP:
	case llvm::Instruction::SIToFP:
	case llvm::Instruction::FPTrunc:
	case llvm::Instruction::FPExt:
	case llvm::Instruction::PtrToInt:
	case llvm::Instruction::IntToPtr:
	case llvm::Instruction::BitCast:
	case llvm::Instruction::AddrSpaceCast:
		return build_constant_cast(impl, cexpr);

	case llvm::Instruction::Add:
	case llvm::Instruction::FAdd:
	case llvm::Instruction::Sub:
	case llvm::Instruction::FSub:
	case llvm::Instruction::Mul:
	case llvm::Instruction::FMul:
	case llvm::Instruction::UDiv:
	case llvm::Instruction::SDiv:
	case llvm::Instruction::FDiv:
	case llvm::Instruction::URem:
	case llvm::Instruction::SRem:
	case llvm::Instruction::FRem:
	case llvm::Instruction::Shl:
	case llvm::Instruction::LShr:
	case llvm::Instruction::AShr:
	case llvm::Instruction::And:
	case llvm::Instruction::Or:
	case llvm::Instruction::Xor:
		return emit_binary_instruction_impl(impl, cexpr);

	default:
	{
		LOGE("Unknown constant-expr.\n");
		break;
	}
	}

	return 0;
}